

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_pcistb(CPUS390XState_conflict *env,uint32_t r1,uint32_t r3,uint64_t gaddr,uint32_t ar)

{
  uint32_t ar_local;
  uint64_t gaddr_local;
  uint32_t r3_local;
  uint32_t r1_local;
  CPUS390XState_conflict *env_local;
  
  return;
}

Assistant:

void HELPER(pcistb)(CPUS390XState *env, uint32_t r1, uint32_t r3,
                    uint64_t gaddr, uint32_t ar)
{
#if 0
    S390CPU *cpu = env_archcpu(env);

    qemu_mutex_lock_iothread();
    pcistb_service_call(cpu, r1, r3, gaddr, ar, GETPC());
    qemu_mutex_unlock_iothread();
#endif
}